

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptFunction.cpp
# Opt level: O3

DescriptorFlags __thiscall
Js::JavascriptFunction::GetSetter
          (JavascriptFunction *this,JavascriptString *propertyNameString,Var *setterValue,
          PropertyValueInfo *info,ScriptContext *requestContext)

{
  bool bVar1;
  PropertyRecord *local_48;
  PropertyRecord *propertyRecord;
  DescriptorFlags local_34 [2];
  DescriptorFlags flags;
  
  propertyRecord = (PropertyRecord *)propertyNameString;
  ScriptContext::FindPropertyRecord
            ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
              ptr)->super_JavascriptLibraryBase).scriptContext.ptr,propertyNameString,&local_48);
  if ((local_48 == (PropertyRecord *)0x0) ||
     (bVar1 = GetSetterBuiltIns(this,local_48->pid,setterValue,info,requestContext,local_34), !bVar1
     )) {
    local_34[0] = DynamicObject::GetSetter
                            (&this->super_DynamicObject,(JavascriptString *)propertyRecord,
                             setterValue,info,requestContext);
  }
  return local_34[0];
}

Assistant:

DescriptorFlags JavascriptFunction::GetSetter(JavascriptString* propertyNameString, Var *setterValue, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        DescriptorFlags flags;
        PropertyRecord const* propertyRecord;
        this->GetScriptContext()->FindPropertyRecord(propertyNameString, &propertyRecord);

        if (propertyRecord != nullptr && GetSetterBuiltIns(propertyRecord->GetPropertyId(), setterValue, info, requestContext, &flags))
        {
            return flags;
        }

        return __super::GetSetter(propertyNameString, setterValue, info, requestContext);
    }